

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O2

wchar_t el_winsertstr(EditLine *el,wchar_t *s)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  size_t addlen;
  
  wVar2 = L'\xffffffff';
  if ((s != (wchar_t *)0x0) && (addlen = wcslen(s), addlen != 0)) {
    if (((el->el_line).limit <= (el->el_line).lastchar + addlen) &&
       (wVar2 = ch_enlargebufs(el,addlen), wVar2 == L'\0')) {
      return L'\xffffffff';
    }
    c_insert(el,(wchar_t)addlen);
    for (; wVar2 = *s, wVar2 != L'\0'; s = s + 1) {
      pwVar1 = (el->el_line).cursor;
      (el->el_line).cursor = pwVar1 + 1;
      *pwVar1 = wVar2;
    }
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int
el_winsertstr(EditLine *el, const wchar_t *s)
{
	size_t len;

	if (s == NULL || (len = wcslen(s)) == 0)
		return -1;
	if (el->el_line.lastchar + len >= el->el_line.limit) {
		if (!ch_enlargebufs(el, len))
			return -1;
	}

	c_insert(el, (int)len);
	while (*s)
		*el->el_line.cursor++ = *s++;
	return 0;
}